

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

work_t __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,float x,float y,int j)

{
  uchar *puVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  iVar4 = 0;
  if (0 < j) {
    iVar4 = j;
  }
  iVar3 = this->depth + -1;
  if (iVar4 < iVar3) {
    iVar3 = iVar4;
  }
  fVar8 = 0.0;
  if (0.0 <= x + -0.5) {
    fVar8 = x + -0.5;
  }
  fVar10 = 0.0;
  if (0.0 <= y + -0.5) {
    fVar10 = y + -0.5;
  }
  uVar7 = -(uint)(fVar8 < (float)(this->width + -1));
  fVar9 = (float)(~uVar7 & (uint)((float)this->width + -1.001) | (uint)fVar8 & uVar7);
  uVar7 = -(uint)(fVar10 < (float)(this->height + -1));
  fVar8 = (float)(~uVar7 & (uint)((float)this->height + -1.001) | (uint)fVar10 & uVar7);
  lVar5 = (long)fVar9;
  lVar6 = (long)fVar8;
  puVar1 = this->img[iVar3][lVar6];
  puVar2 = this->img[iVar3][lVar6 + 1];
  fVar10 = (fVar9 - (float)lVar5) * 4.0;
  fVar8 = (fVar8 - (float)lVar6) * 4.0;
  return (int)((float)puVar2[lVar5 + 1] * fVar10 * fVar8 +
              (float)puVar2[lVar5] * (4.0 - fVar10) * fVar8 +
              (4.0 - fVar8) * (float)puVar1[lVar5] * (4.0 - fVar10) +
              (float)puVar1[lVar5 + 1] * fVar10 * (4.0 - fVar8)) / 0x10;
}

Assistant:

work_t getBilinear(float x, float y, int j=0) const
    {
      long    i, k;
      store_t p0, p1, p2, p3;
      work_t  ret=ptraits::invalid();

      j=std::max(0, j);
      j=std::min(depth-1, j);

      x-=0.5f;
      y-=0.5f;

      if (x < 0)
      {
        x=0;
      }

      if (y < 0)
      {
        y=0;
      }

      if (x >= width-1)
      {
        x=width-1.001f;
      }

      if (y >= height-1)
      {
        y=height-1.001f;
      }

      i=static_cast<long>(x);
      k=static_cast<long>(y);

      x-=i;
      y-=k;

      p0=img[j][k][i];
      p1=img[j][k][i+1];
      p2=img[j][k+1][i];
      p3=img[j][k+1][i+1];

      if (isValidS(p0) && isValidS(p1) && isValidS(p2) && isValidS(p3))
      {
        x*=4;
        y*=4;

        ret=static_cast<work_t>(p0*(4-x)*(4-y)+p1*x*(4-y)+p2*(4-x)*y+p3*x*y);
        ret/=16;
      }

      return ret;
    }